

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hfile_net.c
# Opt level: O1

hFILE * hopen_net(char *filename,char *mode)

{
  hFILE *fp;
  knetFile *pkVar1;
  hFILE *phVar2;
  
  if (net_inited == '\0') {
    net_inited = '\x01';
  }
  fp = hfile_init(0x40,mode,0);
  phVar2 = (hFILE *)0x0;
  if (fp != (hFILE *)0x0) {
    pkVar1 = knet_open(filename,mode);
    fp[1].buffer = (char *)pkVar1;
    if (pkVar1 == (knetFile *)0x0) {
      hfile_destroy(fp);
      phVar2 = (hFILE *)0x0;
    }
    else {
      fp->backend = &net_backend;
      phVar2 = fp;
    }
  }
  return phVar2;
}

Assistant:

hFILE *hopen_net(const char *filename, const char *mode)
{
    hFILE_net *fp;

    // Do any networking initialisation if this is the first use.
    if (! net_inited) { if (net_init() < 0) return NULL; }

    fp = (hFILE_net *) hfile_init(sizeof (hFILE_net), mode, 0);
    if (fp == NULL) return NULL;

    fp->netfp = knet_open(filename, mode);
    if (fp->netfp == NULL) { hfile_destroy((hFILE *) fp); return NULL; }

    fp->base.backend = &net_backend;
    return &fp->base;
}